

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

void __thiscall
GEO::Delaunay2d::add_triangle_to_list(Delaunay2d *this,index_t t,index_t *first,index_t *last)

{
  uint uVar1;
  uint *puVar2;
  index_t *last_local;
  index_t *first_local;
  index_t t_local;
  Delaunay2d *this_local;
  
  if (*last == 0x7fffffff) {
    *last = t;
    *first = t;
    puVar2 = vector<unsigned_int>::operator[](&this->cell_next_,t);
    *puVar2 = 0x7fffffff;
  }
  else {
    uVar1 = *first;
    puVar2 = vector<unsigned_int>::operator[](&this->cell_next_,t);
    *puVar2 = uVar1;
    *first = t;
  }
  return;
}

Assistant:

void add_triangle_to_list(index_t t, index_t& first, index_t& last) {
            geo_debug_assert(t < max_t());
            geo_debug_assert(!triangle_is_in_list(t));
            if(last == END_OF_LIST) {
                geo_debug_assert(first == END_OF_LIST);
                first = last = t;
                cell_next_[t] = END_OF_LIST;
            } else {
                cell_next_[t] = first;
                first = t;
            }
        }